

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupChunk *pCVar1;
  ulong uVar2;
  
  pCVar1 = this->cleanup_;
  do {
    if (pCVar1 == (CleanupChunk *)0x0) {
      uVar2 = 8;
    }
    else {
      uVar2 = pCVar1->size * 2;
      if (0x3f < uVar2) {
        uVar2 = 0x40;
      }
    }
    pCVar1 = (CleanupChunk *)AllocateAligned(this,(ulong)((int)uVar2 * 0x10 + 0x17U & 0xff0));
    pCVar1->next = this->cleanup_;
    pCVar1->size = uVar2;
    this->cleanup_ = pCVar1;
    this->cleanup_ptr_ = pCVar1->nodes;
    this->cleanup_limit_ = pCVar1->nodes + uVar2;
  } while (uVar2 == 0);
  pCVar1->nodes[0].elem = elem;
  pCVar1->nodes[0].cleanup = cleanup;
  this->cleanup_ptr_ = (CleanupNode *)(pCVar1 + 1);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::SerialArena::AddCleanupFallback(void* elem,
                                                void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}